

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

void deqp::gls::ub::anon_unknown_12::generateDeclaration
               (ostringstream *src,VarType *type,char *name,int indentLevel,deUint32 unusedHints)

{
  int iVar1;
  deUint32 dVar2;
  Type TVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  int *piVar8;
  vector<int,_std::allocator<int>_> arraySizes;
  PrecisionFlagsFmt local_5c;
  vector<int,_std::allocator<int>_> local_58;
  deUint32 local_34;
  
  uVar4 = type->m_flags;
  local_34 = unusedHints;
  if ((uVar4 & 0xf8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,"layout(",7);
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(CONCAT44(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,uVar4) & 0xffffffff000000f8);
    ub::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                   (LayoutFlagsFmt *)&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,") ",2);
  }
  if ((uVar4 & 7) != 0) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(CONCAT44(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,uVar4) & 0xffffffff00000007);
    ub::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                   (PrecisionFlagsFmt *)&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
  }
  iVar1 = (int)src;
  if (type->m_type == TYPE_ARRAY) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    TVar3 = TYPE_ARRAY;
    while (TVar3 == TYPE_ARRAY) {
      local_5c.flags = (type->m_data).array.size;
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_5c);
      }
      else {
        *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_5c.flags;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      type = (type->m_data).array.elementType;
      TVar3 = type->m_type;
    }
    if (TVar3 == TYPE_BASIC) {
      uVar4 = type->m_flags & 7;
      if (uVar4 != 0) {
        local_5c.flags = uVar4;
        ub::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,&local_5c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
      }
      pcVar5 = glu::getDataTypeName((type->m_data).basicType);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                     _vptr_basic_ostream[-3]);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5,sVar6);
      }
    }
    else {
      generateLocalDeclaration(src,(type->m_data).structPtr,indentLevel + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
    if (name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,name,sVar6);
    }
    piVar8 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,"[",1);
        poVar7 = (ostream *)std::ostream::operator<<(src,*piVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        piVar8 = piVar8 + 1;
      } while (piVar8 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    if (type->m_type == TYPE_BASIC) {
      pcVar5 = glu::getDataTypeName((type->m_data).basicType);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                     _vptr_basic_ostream[-3]);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5,sVar6);
      }
    }
    else {
      generateLocalDeclaration(src,(type->m_data).structPtr,indentLevel + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
    if (name == (char *)0x0) {
      std::ios::clear(iVar1 + (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,name,sVar6);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&src->super_basic_ostream<char,_std::char_traits<char>_>,";",1);
  dVar2 = local_34;
  if (local_34 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," // unused in ",0xe);
    if (dVar2 == 0x400) {
      pcVar5 = "vertex shader";
    }
    else if (dVar2 == 0xc00) {
      pcVar5 = "both shaders";
    }
    else {
      pcVar5 = "???";
      if (dVar2 == 0x800) {
        pcVar5 = "fragment shader";
      }
    }
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&src->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  return;
}

Assistant:

void generateDeclaration (std::ostringstream& src, const VarType& type, const char* name, int indentLevel, deUint32 unusedHints)
{
	deUint32 flags = type.getFlags();

	if ((flags & LAYOUT_MASK) != 0)
		src << "layout(" << LayoutFlagsFmt(flags & LAYOUT_MASK) << ") ";

	if ((flags & PRECISION_MASK) != 0)
		src << PrecisionFlagsFmt(flags & PRECISION_MASK) << " ";

	if (type.isBasicType())
		src << glu::getDataTypeName(type.getBasicType()) << " " << name;
	else if (type.isArrayType())
	{
		std::vector<int>	arraySizes;
		const VarType*		curType		= &type;
		while (curType->isArrayType())
		{
			arraySizes.push_back(curType->getArraySize());
			curType = &curType->getElementType();
		}

		if (curType->isBasicType())
		{
			if ((curType->getFlags() & PRECISION_MASK) != 0)
				src << PrecisionFlagsFmt(curType->getFlags() & PRECISION_MASK) << " ";
			src << glu::getDataTypeName(curType->getBasicType());
		}
		else
		{
			DE_ASSERT(curType->isStructType());
			generateLocalDeclaration(src, curType->getStruct(), indentLevel+1);
		}

		src << " " << name;

		for (std::vector<int>::const_iterator sizeIter = arraySizes.begin(); sizeIter != arraySizes.end(); sizeIter++)
			src << "[" << *sizeIter << "]";
	}
	else
	{
		generateLocalDeclaration(src, type.getStruct(), indentLevel+1);
		src << " " << name;
	}

	src << ";";

	// Print out unused hints.
	if (unusedHints != 0)
		src << " // unused in " << (unusedHints == UNUSED_BOTH		? "both shaders"	:
									unusedHints == UNUSED_VERTEX	? "vertex shader"	:
									unusedHints == UNUSED_FRAGMENT	? "fragment shader" : "???");

	src << "\n";
}